

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void pre_text_out(c2m_ctx_t c2m_ctx,token_t t)

{
  code cVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  FILE *pFVar5;
  _func_void_macro_t_void_ptr *p_Var6;
  pos_t pVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  VARR_char *in_RAX;
  c2m_ctx_t pcVar14;
  token_t *__ptr;
  c2m_ctx_t pcVar15;
  _func_void_macro_t_void_ptr *p_Var16;
  c2m_ctx_t pcVar17;
  VARR_htab_ind_t *__ptr_00;
  size_t sVar18;
  int *piVar19;
  node_t_conflict n;
  uint uVar20;
  VARR_token_t *pVVar21;
  MIR_context_t pMVar22;
  int extraout_EDX;
  VARR_char_ptr_t *pVVar23;
  MIR_context_t pMVar24;
  char *pcVar25;
  ulong uVar26;
  c2m_ctx_t pcVar27;
  int iVar28;
  VARR_char *pVVar29;
  char *__s1;
  token_t ptVar30;
  c2m_ctx_t pcVar31;
  int iVar32;
  char *pcVar33;
  undefined7 uVar34;
  c2m_ctx_t varr;
  token_t __size;
  code *pcVar35;
  VARR_char *pVVar36;
  code cVar37;
  pre_ctx *ppVar38;
  c2mir_options *__size_00;
  c2m_ctx_t pcVar39;
  void *pvVar40;
  size_t sVar41;
  c2m_ctx_t pcVar42;
  bool bVar43;
  longdouble in_ST0;
  float fVar44;
  double dVar45;
  str_t sVar46;
  int iStack_114;
  int *piStack_110;
  uint uStack_108;
  int iStack_104;
  tab_str_t tStack_f8;
  c2m_ctx_t pcStack_d8;
  VARR_char *pVStack_d0;
  pre_ctx *ppStack_c8;
  c2m_ctx_t pcStack_c0;
  c2m_ctx_t pcStack_b8;
  VARR_char *pVStack_b0;
  c2m_ctx_t pcStack_a0;
  c2m_ctx_t pcStack_98;
  c2m_ctx_t pcStack_90;
  VARR_char *pVStack_88;
  int iStack_7c;
  long lStack_78;
  c2m_ctx_t pcStack_70;
  token_t ptStack_68;
  VARR_char *pVStack_60;
  pre_ctx *ppStack_58;
  FILE *pFStack_50;
  c2m_ctx_t pcStack_48;
  VARR_char *pVStack_40;
  VARR_char *local_38;
  
  ppVar38 = c2m_ctx->pre_ctx;
  pFVar5 = (FILE *)c2m_ctx->options->prepro_output_file;
  if (((t == (token_t)0x0) && (ppVar38->pre_last_token != (token_t)0x0)) &&
     (*(short *)ppVar38->pre_last_token == 10)) {
    fputc(10,pFVar5);
    return;
  }
  sVar4 = *(short *)t;
  if (sVar4 == 10) goto LAB_0018f941;
  pVVar36 = (VARR_char *)&ppVar38->actual_pre_pos;
  local_38 = in_RAX;
  if ((ppVar38->actual_pre_pos).fname == (t->pos).fname) {
    iVar28 = (ppVar38->actual_pre_pos).lno;
    iVar32 = (t->pos).lno;
    if (iVar28 != iVar32) {
      if (iVar28 + 4 < iVar32 || iVar32 <= iVar28) goto LAB_0018f7f3;
      do {
        pVStack_40 = (VARR_char *)0x18f985;
        fputc(10,pFVar5);
        iVar28 = (ppVar38->actual_pre_pos).lno + 1;
        (ppVar38->actual_pre_pos).lno = iVar28;
      } while (iVar28 != (t->pos).lno);
      goto LAB_0018f8c0;
    }
  }
  else {
LAB_0018f7f3:
    if (ppVar38->pre_last_token != (token_t)0x0) {
      pVStack_40 = (VARR_char *)0x18f80a;
      fputc(10,pFVar5);
    }
    pVStack_40 = (VARR_char *)0x18f81e;
    fprintf(pFVar5,"#line %d",(ulong)(uint)(t->pos).lno);
    pcVar27 = (c2m_ctx_t)(t->pos).fname;
    if ((c2m_ctx_t)((pos_t *)pVVar36)->fname != pcVar27) {
      ptVar30 = (token_t)c2m_ctx->temp_string;
      pVStack_40 = (VARR_char *)0x18f838;
      stringify((char *)pcVar27,(VARR_char *)ptVar30);
      pVVar29 = c2m_ctx->temp_string;
      pcVar14 = (c2m_ctx_t)pVVar29->varr;
      if (pcVar14 == (c2m_ctx_t)0x0) {
        pVStack_40 = (VARR_char *)0x18f9a4;
        pre_text_out_cold_2();
      }
      else {
        sVar41 = pVVar29->els_num;
        uVar26 = sVar41 + 1;
        if (pVVar29->size < uVar26) {
          __size = (token_t)((uVar26 >> 1) + uVar26);
          pVStack_40 = (VARR_char *)0x18f872;
          ptVar30 = __size;
          pcVar27 = pcVar14;
          local_38 = pVVar36;
          pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)__size);
          pVVar29->varr = (char *)pcVar14;
          pVVar29->size = (size_t)__size;
          sVar41 = pVVar29->els_num;
          uVar26 = sVar41 + 1;
          pVVar36 = local_38;
        }
        pVVar29->els_num = uVar26;
        *(undefined1 *)((long)pcVar14->env[0].__jmpbuf + (sVar41 - 0x10)) = 0;
        if (c2m_ctx->temp_string != (VARR_char *)0x0) {
          pVStack_40 = (VARR_char *)0x18f8b3;
          fprintf(pFVar5," %s",c2m_ctx->temp_string->varr);
          goto LAB_0018f8b3;
        }
      }
      pVStack_40 = (VARR_char *)pre_out;
      pre_text_out_cold_1();
      ptStack_68 = t;
      pVStack_60 = pVVar36;
      ppStack_58 = ppVar38;
      pFStack_50 = pFVar5;
      pcStack_48 = c2m_ctx;
      pVStack_40 = pVVar29;
      if (ptVar30 == (token_t)0x0) {
        ptVar30 = pcVar27->pre_ctx->pre_last_token;
        if (ptVar30 == (token_t)0x0) {
          pvVar40 = (void *)0xffffffffffffffff;
          pcVar33 = (char *)0x0;
        }
        else {
          pcVar33 = (ptVar30->pos).fname;
          pvVar40 = *(void **)&(ptVar30->pos).lno;
        }
        pVStack_88 = (VARR_char *)0x18fafb;
        pcVar14 = (c2m_ctx_t)reg_malloc(pcVar27,0x30);
        *(htab_size_t *)&pcVar14->ctx = 0x13d;
        ((pos_t *)&pcVar14->options)->fname = pcVar33;
        pcVar14->env[0].__jmpbuf[0] = (long)pvVar40;
        pcVar14->env[0].__jmpbuf[3] = (long)"<EOF>";
        *(undefined4 *)(pcVar14->env[0].__jmpbuf + 1) = 0;
        pcVar14->env[0].__jmpbuf[2] = 0;
LAB_0018fb27:
        pVVar21 = pcVar27->recorded_tokens;
        __ptr = pVVar21->varr;
        if (__ptr != (token_t *)0x0) {
          sVar41 = pVVar21->els_num;
          uVar26 = sVar41 + 1;
          if (pVVar21->size < uVar26) {
            sVar41 = (uVar26 >> 1) + uVar26;
            pVStack_88 = (VARR_char *)0x18fb61;
            __ptr = (token_t *)realloc(__ptr,sVar41 * 8);
            pVVar21->varr = __ptr;
            pVVar21->size = sVar41;
            sVar41 = pVVar21->els_num;
            uVar26 = sVar41 + 1;
          }
          pVVar21->els_num = uVar26;
          __ptr[sVar41] = (token_t)pcVar14;
          return;
        }
        goto LAB_0018ff5b;
      }
      if ((*(short *)ptVar30 == -1) || (*(short *)ptVar30 == 0x147)) {
        pVStack_88 = (VARR_char *)0x18ff51;
        __assert_fail("t->code != T_EOU && t->code != EOF",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
      }
      pcVar27->pre_ctx->pre_last_token = ptVar30;
      pVStack_88 = (VARR_char *)0x18f9f9;
      pcVar31 = pcVar27;
      pcVar14 = (c2m_ctx_t)pptoken2token(pcVar27,ptVar30,1);
      if (pcVar14 == (c2m_ctx_t)0x0) {
        return;
      }
      if (*(short *)&pcVar14->ctx != 0x102) goto LAB_0018fb27;
      pVVar21 = pcVar27->recorded_tokens;
      if (pVVar21 == (VARR_token_t *)0x0) goto LAB_0018ff60;
      sVar41 = pVVar21->els_num;
      if (sVar41 == 0) goto LAB_0018fb27;
      if (pVVar21->varr == (token_t *)0x0) goto LAB_0018ff6f;
      pcVar39 = (c2m_ctx_t)pVVar21->varr[sVar41 - 1];
      if (*(short *)&pcVar39->ctx != 0x102) goto LAB_0018fb27;
      pVVar21->els_num = sVar41 - 1;
      pVVar29 = pcVar27->temp_string;
      if ((pVVar29 != (VARR_char *)0x0) && (pVVar29->varr != (char *)0x0)) {
        pVVar29->els_num = 0;
        p_Var16 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
        cVar37 = *p_Var16;
        uVar20 = (uint)(byte)cVar37;
        uVar34 = (undefined7)((ulong)pcVar31 >> 8);
        if ((cVar37 == (code)0x4c) || (cVar37 == (code)0x55)) {
LAB_0018fb86:
          pcVar31 = (c2m_ctx_t)pcVar14->env[0].__jmpbuf[3];
          pVVar29 = (VARR_char *)&DAT_00000001;
          cVar1 = *(code *)&pcVar31->ctx;
          varr = (c2m_ctx_t)CONCAT71(uVar34,cVar1);
          if (cVar1 != (code)0x22) {
            bVar43 = true;
            if (cVar1 == cVar37) {
              bVar43 = *(code *)((long)&pcVar31->ctx + 1) == (code)0x38;
              varr = (c2m_ctx_t)(ulong)uVar20;
            }
LAB_0018fbca:
            if (((char)varr != 'L') && (uVar12 = (uint)varr & 0xff, uVar12 != 0x55)) {
              if (uVar12 == 0x75) goto LAB_0018fbe4;
              lStack_78 = 0;
              if (!bVar43) goto LAB_0018fc67;
              goto LAB_0018fc48;
            }
            goto LAB_0018fc0b;
          }
LAB_0018fb98:
          lStack_78 = 0;
LAB_0018fc67:
          iStack_7c = 0x4c;
          if (cVar37 != (code)0x4c) goto LAB_0018fc74;
LAB_0018fc8c:
          pcVar42 = (c2m_ctx_t)(pcVar14->env[0].__jmpbuf + 3);
          ppVar38 = (pre_ctx *)pcVar27->temp_string;
          pcVar15 = (c2m_ctx_t)ppVar38->macro_tab;
          if (pcVar15 != (c2m_ctx_t)0x0) {
            pVVar23 = ppVar38->once_include_files;
            pVVar21 = (VARR_token_t *)((long)&pVVar23->els_num + 1);
            if (ppVar38->temp_tokens < pVVar21) {
              pcVar42 = (c2m_ctx_t)((long)&pVVar21->els_num + ((ulong)pVVar21 >> 1));
              pVStack_88 = (VARR_char *)0x18fcc2;
              pcVar31 = pcVar42;
              varr = pcVar15;
              pcVar15 = (c2m_ctx_t)realloc(pcVar15,(size_t)pcVar42);
              ppVar38->macro_tab = (HTAB_macro_t *)pcVar15;
              ppVar38->temp_tokens = (VARR_token_t *)pcVar42;
              pVVar23 = ppVar38->once_include_files;
              pVVar21 = (VARR_token_t *)((long)&pVVar23->els_num + 1);
            }
            ppVar38->once_include_files = (VARR_char_ptr_t *)pVVar21;
            *(char *)((long)pcVar15->env[0].__jmpbuf + (long)&pVVar23[-1].size) = (char)iStack_7c;
            p_Var16 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
            goto LAB_0018fce6;
          }
LAB_0018ffbc:
          pVStack_88 = (VARR_char *)stringify;
          pre_out_cold_6();
          pcVar14 = pcVar31;
          pcVar15 = varr;
          pcStack_a0 = pcVar27;
          pcStack_98 = pcVar39;
          pcStack_90 = pcVar42;
          pVStack_88 = pVVar29;
          if ((pcVar31 != (c2m_ctx_t)0x0) &&
             (pcVar17 = (c2m_ctx_t)pcVar31->env[0].__jmpbuf[0], pcVar27 = pcVar31,
             pcVar17 != (c2m_ctx_t)0x0)) {
            pcVar31->ctx = (MIR_context_t)0x0;
            if (pcVar31->options == (c2mir_options *)0x0) {
              pcVar14 = (c2m_ctx_t)&DAT_00000001;
              pVStack_b0 = (VARR_char *)0x190008;
              pcVar15 = pcVar17;
              pcVar17 = (c2m_ctx_t)realloc(pcVar17,1);
              pcVar31->env[0].__jmpbuf[0] = (long)pcVar17;
              pcVar31->options = (c2mir_options *)&DAT_00000001;
              pMVar22 = pcVar31->ctx;
              pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
            }
            else {
              pMVar24 = (MIR_context_t)&DAT_00000001;
              pMVar22 = (MIR_context_t)0x0;
            }
            pcVar31->ctx = pMVar24;
            *(code *)((long)&pMVar22->temp_ops + (long)(pcVar17->env + -1)) = (code)0x22;
            while( true ) {
              bVar3 = *(byte *)&varr->ctx;
              pVVar29 = (VARR_char *)(ulong)bVar3;
              pcVar39 = varr;
              if ((bVar3 == 0x22) || (bVar3 == 0x5c)) {
                pcVar17 = (c2m_ctx_t)pcVar31->env[0].__jmpbuf[0];
                if (pcVar17 == (c2m_ctx_t)0x0) goto LAB_0019011c;
                pMVar22 = pcVar31->ctx;
                pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
                if ((MIR_context_t)pcVar31->options < pMVar24) {
                  pcVar42 = (c2m_ctx_t)((long)&pMVar24->gen_ctx + ((ulong)pMVar24 >> 1));
                  pVStack_b0 = (VARR_char *)0x190067;
                  pcVar14 = pcVar42;
                  pcVar15 = pcVar17;
                  pcVar17 = (c2m_ctx_t)realloc(pcVar17,(size_t)pcVar42);
                  pcVar31->env[0].__jmpbuf[0] = (long)pcVar17;
                  pcVar31->options = (c2mir_options *)pcVar42;
                  pMVar22 = pcVar31->ctx;
                  pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
                }
                pcVar31->ctx = pMVar24;
                *(code *)((long)&pMVar22->temp_ops + (long)(pcVar17->env + -1)) = (code)0x5c;
                pVVar29 = (VARR_char *)(ulong)*(byte *)&varr->ctx;
              }
              else if (bVar3 == 0) {
                __ptr_00 = (VARR_htab_ind_t *)pcVar31->env[0].__jmpbuf[0];
                if (__ptr_00 != (VARR_htab_ind_t *)0x0) {
                  pMVar22 = pcVar31->ctx;
                  pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
                  if ((MIR_context_t)pcVar31->options < pMVar24) {
                    __size_00 = (c2mir_options *)((long)&pMVar24->gen_ctx + ((ulong)pMVar24 >> 1));
                    pVStack_b0 = (VARR_char *)0x1900f6;
                    __ptr_00 = (VARR_htab_ind_t *)realloc(__ptr_00,(size_t)__size_00);
                    pcVar31->env[0].__jmpbuf[0] = (long)__ptr_00;
                    pcVar31->options = __size_00;
                    pMVar22 = pcVar31->ctx;
                    pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
                  }
                  pcVar31->ctx = pMVar24;
                  *(code *)((long)&pMVar22->gen_ctx + (long)&__ptr_00->els_num) = (code)0x22;
                  return;
                }
                goto LAB_00190126;
              }
              pcVar17 = (c2m_ctx_t)pcVar31->env[0].__jmpbuf[0];
              if (pcVar17 == (c2m_ctx_t)0x0) break;
              pMVar22 = pcVar31->ctx;
              pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
              if ((MIR_context_t)pcVar31->options < pMVar24) {
                pcVar42 = (c2m_ctx_t)((long)&pMVar24->gen_ctx + ((ulong)pMVar24 >> 1));
                pVStack_b0 = (VARR_char *)0x1900ae;
                pcVar14 = pcVar42;
                pcVar15 = pcVar17;
                pcVar17 = (c2m_ctx_t)realloc(pcVar17,(size_t)pcVar42);
                pcVar31->env[0].__jmpbuf[0] = (long)pcVar17;
                pcVar31->options = (c2mir_options *)pcVar42;
                pMVar22 = pcVar31->ctx;
                pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
              }
              pcVar31->ctx = pMVar24;
              *(code *)((long)&pMVar22->temp_ops + (long)(pcVar17->env + -1)) = SUB81(pVVar29,0);
              varr = (c2m_ctx_t)((long)&varr->ctx + 1);
            }
            pVStack_b0 = (VARR_char *)0x19011c;
            stringify_cold_3();
LAB_0019011c:
            pVStack_b0 = (VARR_char *)0x190121;
            stringify_cold_1();
          }
          pVStack_b0 = (VARR_char *)0x190126;
          stringify_cold_4();
LAB_00190126:
          pVStack_b0 = (VARR_char *)pptoken2token;
          stringify_cold_2();
          uVar20 = *(uint *)&pcVar14->ctx;
          uVar12 = (uVar20 & 0xffff) - 0x13d;
          pcStack_d8 = pcVar27;
          pVStack_d0 = pVVar36;
          ppStack_c8 = ppVar38;
          pcStack_c0 = pcVar39;
          pcStack_b8 = pcVar42;
          pVStack_b0 = pVVar29;
          if (uVar12 < 0xb) {
            if (uVar12 == 2) {
              uVar20 = uVar20 & 0xffff0103;
              *(uint *)&pcVar14->ctx = uVar20;
            }
            else if ((0x7f3U >> (uVar12 & 0x1f) & 1) != 0) {
              __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
            }
          }
          iVar28 = uVar20 << 0x10;
          if (extraout_EDX != 0 && iVar28 == 0x1030000) {
            pcVar33 = (char *)pcVar14->env[0].__jmpbuf[3];
            sVar18 = strlen(pcVar33);
            str_add(&tStack_f8,pcVar15,pcVar33,sVar18 + 1,0x102,0,0);
            if (tStack_f8.key == 0x102) {
              return;
            }
            *(short *)&pcVar14->ctx = (short)tStack_f8.key;
            *(undefined4 *)(pcVar14->env[0].__jmpbuf + 1) = 0;
            pcVar14->env[0].__jmpbuf[2] = 0;
            return;
          }
          if (iVar28 == 0xa0000) {
            return;
          }
          if (iVar28 == 0x200000) {
            return;
          }
          if (iVar28 != 0x1000000) {
            return;
          }
          pcVar33 = (char *)pcVar14->env[0].__jmpbuf[3];
          sVar18 = strlen(pcVar33);
          uVar20 = (uint)sVar18;
          if ((int)uVar20 < 1) {
            __assert_fail("last >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
          }
          bVar43 = false;
          pcVar25 = pcVar33;
          if (*pcVar33 == '0') {
            bVar3 = pcVar33[1];
            bVar8 = true;
            iStack_104 = 0x10;
            bVar11 = 0;
            if (bVar3 < 0x62) {
              if (bVar3 == 0x42) {
LAB_0019026d:
                pcVar35 = error;
                if (pcVar15->options->pedantic_p == 0) {
                  pcVar35 = warning;
                }
                bVar8 = false;
                (*pcVar35)(pcVar15,pcVar14->options,(VARR_htab_ind_t *)pcVar14->env[0].__jmpbuf[0],
                           "binary number is not a standard: %s",pcVar33);
                bVar11 = 1;
                iStack_104 = 2;
                pcVar25 = pcVar33 + 2;
              }
              else {
                bVar11 = 0;
                if (bVar3 != 0x58) {
LAB_001905dd:
                  iStack_104 = 8;
                  goto LAB_00190253;
                }
              }
            }
            else if (bVar3 != 0x78) {
              if (bVar3 != 0x62) goto LAB_001905dd;
              goto LAB_0019026d;
            }
          }
          else {
            iStack_104 = 10;
LAB_00190253:
            bVar11 = 1;
            bVar8 = false;
          }
          uStack_108 = uVar20 - 1;
          uVar26 = 0;
          do {
            bVar3 = pcVar33[uVar26];
            if (bVar3 < 0x65) {
              if ((bVar3 == 0x2e) || (bVar3 == 0x50)) goto LAB_001902f5;
LAB_001902e8:
              if ((bool)(bVar11 & bVar3 == 0x45)) goto LAB_001902f5;
            }
            else {
              if (bVar3 == 0x65) {
                if (bVar8) goto LAB_001902fb;
              }
              else if (bVar3 != 0x70) goto LAB_001902e8;
LAB_001902f5:
              bVar43 = true;
            }
LAB_001902fb:
            uVar26 = uVar26 + 1;
          } while ((uVar20 & 0x7fffffff) != uVar26);
          if ((int)uVar20 < 3) {
            if (uVar20 == 1) goto LAB_0019040b;
LAB_00190455:
            uVar26 = (ulong)(uVar20 - 2);
            cVar2 = pcVar33[uVar26];
            if (cVar2 == 'L') {
              if ((pcVar33[uVar26 + 1] == 'L') && (pcVar33[uVar26 + 2] == '\0')) {
LAB_0019069f:
                iVar28 = 1;
                bVar8 = true;
                bVar3 = 0;
                iVar32 = -3;
                piStack_110._0_4_ = 0;
                iStack_114 = 0;
                bVar11 = 1;
                goto LAB_0019072c;
              }
              bVar9 = false;
              bVar8 = false;
              if (pcVar33[uVar26 + 1] != 'U') goto LAB_001906c4;
              if (pcVar33[uVar26 + 2] != '\0') {
                bVar9 = false;
                goto LAB_0019069b;
              }
LAB_0019071b:
              piStack_110._0_4_ = 1;
              bVar8 = false;
              bVar3 = 1;
              iVar32 = -3;
              iStack_114 = 1;
LAB_00190728:
              bVar11 = 0;
              iVar28 = 0;
              goto LAB_0019072c;
            }
            if (cVar2 == 'U') {
              if (pcVar33[uVar26 + 1] == 'L') {
                if (pcVar33[uVar26 + 2] != '\0') {
                  bVar9 = true;
LAB_0019069b:
                  bVar8 = false;
                  goto LAB_001906c4;
                }
              }
              else {
LAB_001906f6:
                if ((pcVar33[uVar26 + 1] != 'l') || (pcVar33[uVar26 + 2] != '\0'))
                goto LAB_0019040b;
              }
              goto LAB_0019071b;
            }
            if (cVar2 != 'u') {
              if (cVar2 != 'l') goto LAB_0019040b;
              if ((pcVar33[uVar26 + 1] == 'l') && (pcVar33[uVar26 + 2] == '\0')) goto LAB_0019069f;
              bVar9 = false;
              if (pcVar33[uVar26 + 1] == 'u') {
                bVar8 = true;
                if (pcVar33[uVar26 + 2] == '\0') goto LAB_0019071b;
                bVar9 = false;
              }
              else {
                bVar8 = true;
              }
LAB_001906c4:
              if (((cVar2 != 'L') || (pcVar33[uVar26 + 1] != 'u')) || (pcVar33[uVar26 + 2] != '\0'))
              goto LAB_001906d9;
              goto LAB_0019071b;
            }
            if ((pcVar33[uVar26 + 1] == 'l') && (pcVar33[uVar26 + 2] == '\0')) goto LAB_0019071b;
            iVar28 = 0;
            bVar9 = false;
            bVar8 = false;
            if (pcVar33[uVar26 + 1] == 'L') {
              if (pcVar33[uVar26 + 2] == '\0') {
                piStack_110._0_4_ = 1;
                bVar3 = 1;
                iVar32 = -3;
                bVar8 = false;
                iStack_114 = 1;
                bVar11 = 0;
                goto LAB_0019072c;
              }
            }
            else {
LAB_001906d9:
              if (((bVar8) && (pcVar33[uVar26 + 1] == 'U')) && (pcVar33[uVar26 + 2] == '\0'))
              goto LAB_0019071b;
              if (bVar9) goto LAB_001906f6;
            }
LAB_0019040b:
            bVar3 = pcVar33[uStack_108];
            if (0x6b < bVar3) {
              if (bVar3 == 0x6c) goto LAB_001904da;
              if (bVar3 != 0x75) goto LAB_001904e6;
              if (pcVar33[(ulong)uStack_108 + 1] == '\0') goto LAB_001905ea;
              if (!bVar43) goto LAB_001905d0;
              goto LAB_001907b3;
            }
            if (bVar3 == 0x4c) {
LAB_001904da:
              if (pcVar33[(ulong)uStack_108 + 1] != '\0') goto LAB_001904e6;
              iStack_114 = 1;
              bVar3 = 0;
              iVar32 = -2;
              piStack_110._0_4_ = 0;
              bVar8 = false;
              goto LAB_00190728;
            }
            if ((bVar3 == 0x55) && (pcVar33[(ulong)uStack_108 + 1] == '\0')) {
LAB_001905ea:
              iStack_114 = 0;
              piStack_110._0_4_ = 1;
              bVar3 = 1;
              iVar32 = -2;
              bVar8 = true;
              goto LAB_00190728;
            }
LAB_001904e6:
            if (bVar43) {
              if (((bVar3 == 0x66) || (bVar3 == 0x46)) && (pcVar33[(ulong)uStack_108 + 1] == '\0'))
              {
                uStack_108 = uVar20 - 2;
                piStack_110 = __errno_location();
                *piStack_110 = 0;
                fVar44 = strtof(pcVar25,(char **)&tStack_f8);
                pVar7 = *(pos_t *)&pcVar14->options;
                n = new_node(pcVar15,N_F);
                add_pos(pcVar15,n,pVar7);
                bVar3 = 1;
                bVar10 = 0;
                bVar11 = 0;
                (n->u).f = fVar44;
                goto LAB_0019084f;
              }
              goto LAB_001907b3;
            }
LAB_001905d0:
            piStack_110._0_4_ = 0;
            iStack_114 = 0;
            iVar28 = 0;
LAB_0019076b:
            piVar19 = __errno_location();
            *piVar19 = 0;
            n = get_int_node_from_repr
                          (pcVar15,pcVar25,(char **)&tStack_f8,iStack_104,(int)piStack_110,
                           iStack_114,iVar28,*(pos_t *)&pcVar14->options);
            bVar10 = 0;
            piStack_110 = piVar19;
LAB_0019084b:
            bVar11 = 0;
          }
          else {
            __s1 = pcVar33 + (uVar20 - 3);
            iVar28 = strcmp(__s1,"LLU");
            bVar3 = 1;
            iVar32 = -4;
            iStack_114 = 0;
            piStack_110._0_4_ = 1;
            if (iVar28 == 0) {
              bVar8 = true;
              bVar11 = 1;
              iVar28 = 1;
            }
            else {
              iVar28 = strcmp(__s1,"ULL");
              if (((((iVar28 == 0) || (iVar28 = strcmp(__s1,"llu"), iVar28 == 0)) ||
                   (iVar28 = strcmp(__s1,"ull"), iVar28 == 0)) ||
                  ((iVar28 = strcmp(__s1,"LLu"), iVar28 == 0 ||
                   (iVar28 = strcmp(__s1,"uLL"), iVar28 == 0)))) ||
                 (iVar28 = strcmp(__s1,"llU"), iVar28 == 0)) {
                bVar8 = true;
                bVar11 = 1;
                iVar28 = 1;
                bVar3 = 1;
                iVar32 = -4;
              }
              else {
                iVar13 = strcmp(__s1,"Ull");
                bVar8 = true;
                bVar11 = 1;
                iVar28 = 1;
                bVar3 = 1;
                iVar32 = -4;
                if (iVar13 != 0) goto LAB_00190455;
              }
            }
LAB_0019072c:
            uStack_108 = iVar32 + uVar20;
            if (!bVar43) goto LAB_0019076b;
            if (!(bool)(bVar3 | bVar11)) {
              if (bVar8) goto LAB_001907b3;
              piStack_110 = __errno_location();
              *piStack_110 = 0;
              strtold(pcVar25,(char **)&tStack_f8);
              n = new_ld_node(pcVar15,in_ST0,*(pos_t *)&pcVar14->options);
              bVar10 = 1;
              goto LAB_0019084b;
            }
            error(pcVar15,0x1c11e6,(char *)pcVar14->options,
                  (VARR_htab_ind_t *)pcVar14->env[0].__jmpbuf[0],pcVar33);
LAB_001907b3:
            piStack_110 = __errno_location();
            *piStack_110 = 0;
            dVar45 = strtod(pcVar25,(char **)&tStack_f8);
            pVar7 = *(pos_t *)&pcVar14->options;
            n = new_node(pcVar15,N_D);
            add_pos(pcVar15,n,pVar7);
            bVar11 = 1;
            bVar10 = 0;
            (n->u).d = dVar45;
          }
          bVar3 = 0;
LAB_0019084f:
          pcVar14->env[0].__jmpbuf[2] = (long)n;
          if (tStack_f8.str.s == pcVar33 + (long)(int)uStack_108 + 1) {
            if (*piStack_110 != 0) {
              if ((bool)(bVar10 | bVar11 | bVar3)) {
                warning(pcVar15,0x1c1201,(char *)pcVar14->options,
                        (VARR_htab_ind_t *)pcVar14->env[0].__jmpbuf[0],pcVar14->env[0].__jmpbuf[3]);
              }
              else {
                pcVar35 = error;
                if (pcVar15->options->pedantic_p == 0) {
                  pcVar35 = warning;
                }
                (*pcVar35)(pcVar15,pcVar14->options,(VARR_htab_ind_t *)pcVar14->env[0].__jmpbuf[0],
                           "number %s is out of range",pcVar14->env[0].__jmpbuf[3]);
              }
            }
          }
          else {
            pFVar5 = (FILE *)pcVar15->options->message_file;
            if (pFVar5 != (FILE *)0x0) {
              fprintf(pFVar5,"%s:%s:%s\n",pcVar33);
            }
            error(pcVar15,0x1c11e6,(char *)pcVar14->options,
                  (VARR_htab_ind_t *)pcVar14->env[0].__jmpbuf[0],pcVar14->env[0].__jmpbuf[3]);
          }
          return;
        }
        if (uVar20 != 0x75) {
          pcVar31 = (c2m_ctx_t)pcVar14->env[0].__jmpbuf[3];
          pVVar29 = (VARR_char *)0x0;
          bVar43 = false;
          varr = (c2m_ctx_t)CONCAT71(uVar34,*(code *)&pcVar31->ctx);
          goto LAB_0018fbca;
        }
        if (p_Var16[1] != (_func_void_macro_t_void_ptr)0x38) goto LAB_0018fb86;
        pcVar31 = (c2m_ctx_t)pcVar14->env[0].__jmpbuf[3];
        pVVar29 = (VARR_char *)&DAT_00000002;
        cVar1 = *(code *)&pcVar31->ctx;
        varr = (c2m_ctx_t)(ulong)(byte)cVar1;
        if (cVar1 == (code)0x22) goto LAB_0018fb98;
        if (cVar1 != (code)0x75) {
          bVar43 = true;
          goto LAB_0018fbca;
        }
LAB_0018fbe4:
        varr = (c2m_ctx_t)CONCAT71((int7)((ulong)varr >> 8),0x75);
        if (*(code *)((long)&pcVar31->ctx + 1) == (code)0x38) {
          pcVar31 = (c2m_ctx_t)0x0;
          lStack_78 = 2;
          if ((uVar20 != 0x22) &&
             ((uVar20 != 0x75 ||
              (cVar37 = (code)0x75, p_Var16[1] != (_func_void_macro_t_void_ptr)0x38)))) {
LAB_0018fc48:
            pcVar31 = (c2m_ctx_t)((pos_t *)&pcVar14->options)->fname;
            pVStack_88 = (VARR_char *)0x18fc61;
            varr = pcVar27;
            error(pcVar27,0x1c1066,(char *)pcVar31,(void *)pcVar14->env[0].__jmpbuf[0]);
            p_Var16 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
            cVar37 = *p_Var16;
            goto LAB_0018fc67;
          }
        }
        else {
LAB_0018fc0b:
          if (cVar37 != (code)0x22) {
            pcVar31 = (c2m_ctx_t)&DAT_00000001;
            lStack_78 = 1;
            if ((SUB81(varr,0) != cVar37) ||
               (lStack_78 = 1, p_Var16[1] == (_func_void_macro_t_void_ptr)0x38)) goto LAB_0018fc48;
            goto LAB_0018fc67;
          }
          cVar37 = (code)0x22;
          lStack_78 = 1;
        }
LAB_0018fc74:
        p_Var6 = (_func_void_macro_t_void_ptr *)pcVar14->env[0].__jmpbuf[3];
        iStack_7c = 0x4c;
        cVar2 = (char)*p_Var6;
        pcVar31 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar31 >> 8),cVar2);
        if (((cVar2 == 'L') || (iStack_7c = 0x55, cVar37 == (code)0x55)) || (cVar2 == 'U'))
        goto LAB_0018fc8c;
        if (cVar37 == (code)0x75) {
          if (p_Var16[1] == (_func_void_macro_t_void_ptr)0x38) {
LAB_0018ff02:
            varr = (c2m_ctx_t)pcVar27->temp_string;
            pcVar31 = (c2m_ctx_t)0x75;
            pVStack_88 = (VARR_char *)0x18ff13;
            VARR_charpush((VARR_char *)varr,'u');
            iStack_7c = 0x38;
          }
          else {
            iStack_7c = 0x75;
            if (cVar2 == 'u') goto LAB_0018fef8;
          }
          goto LAB_0018fc8c;
        }
        iStack_7c = 0x20;
        if (cVar2 == 'u') {
LAB_0018fef8:
          iStack_7c = 0x75;
          if (p_Var6[1] == (_func_void_macro_t_void_ptr)0x38) goto LAB_0018ff02;
          goto LAB_0018fc8c;
        }
LAB_0018fce6:
        pcVar42 = (c2m_ctx_t)(pcVar14->env[0].__jmpbuf + 3);
        cVar37 = p_Var16[(long)pVVar29];
        pcStack_70 = pcVar42;
        if (cVar37 != (code)0x0) {
          pVVar29 = (VARR_char *)((undefined1 *)((long)&pVVar29->els_num + 1) + (long)p_Var16);
          do {
            pcVar42 = (c2m_ctx_t)pcVar27->temp_string;
            pcVar14 = (c2m_ctx_t)pcVar42->env[0].__jmpbuf[0];
            if (pcVar14 == (c2m_ctx_t)0x0) {
              pVStack_88 = (VARR_char *)0x18ff56;
              pre_out_cold_1();
              goto LAB_0018ff56;
            }
            pMVar22 = pcVar42->ctx;
            pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
            if ((MIR_context_t)pcVar42->options < pMVar24) {
              pcVar15 = (c2m_ctx_t)((long)&pMVar24->gen_ctx + ((ulong)pMVar24 >> 1));
              pVStack_88 = (VARR_char *)0x18fd29;
              pcVar31 = pcVar15;
              varr = pcVar14;
              pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)pcVar15);
              pcVar42->env[0].__jmpbuf[0] = (long)pcVar14;
              pcVar42->options = (c2mir_options *)pcVar15;
              pMVar22 = pcVar42->ctx;
              pMVar24 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
            }
            pcVar42->ctx = pMVar24;
            *(code *)((long)&pMVar22->temp_ops + (long)(pcVar14->env + -1)) = cVar37;
            cVar37 = *(code *)&pVVar29->els_num;
            pVVar29 = (VARR_char *)((long)&pVVar29->els_num + 1);
          } while (cVar37 != (code)0x0);
        }
        pVVar36 = pcVar27->temp_string;
        if (((pVVar36 == (VARR_char *)0x0) || (pVVar36->varr == (char *)0x0)) ||
           (pcVar33 = (char *)pVVar36->els_num, pcVar33 == (char *)0x0)) goto LAB_0018ff65;
        if (pVVar36->varr[(long)(pcVar33 + -1)] != '\"') goto LAB_0018ff79;
        pVVar36->els_num = (size_t)(pcVar33 + -1);
        cVar37 = *(code *)((long)&pcStack_70->ctx->gen_ctx + lStack_78 + 1);
        ppVar38 = (pre_ctx *)CONCAT71((int7)((ulong)ppVar38 >> 8),cVar37);
        if (cVar37 == (code)0x0) {
LAB_0018fe0e:
          pcVar14 = (c2m_ctx_t)pVVar36->varr;
          if ((pcVar14 != (c2m_ctx_t)0x0) &&
             (pcVar33 = (char *)pVVar36->els_num, pcVar33 != (char *)0x0)) {
            if ((pcVar33 + -0x11)[(long)pcVar14->env[0].__jmpbuf] != '\"') {
              pVStack_88 = (VARR_char *)0x18ffb7;
              __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
            }
            pcVar25 = pcVar33 + 1;
            if ((char *)pVVar36->size < pcVar25) {
              pcVar42 = (c2m_ctx_t)(pcVar25 + ((ulong)pcVar25 >> 1));
              pVStack_88 = (VARR_char *)0x18fe53;
              pcVar31 = pcVar42;
              varr = pcVar14;
              pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)pcVar42);
              pVVar36->varr = (char *)pcVar14;
              pVVar36->size = (size_t)pcVar42;
              pcVar33 = (char *)pVVar36->els_num;
              pcVar25 = pcVar33 + 1;
            }
            pVVar36->els_num = (size_t)pcVar25;
            (pcVar33 + -0x10)[(long)pcVar14->env[0].__jmpbuf] = '\0';
            if (pcVar27->temp_string != (VARR_char *)0x0) {
              pVStack_88 = (VARR_char *)0x18fe89;
              sVar46 = uniq_cstr(pcVar27,pcVar27->temp_string->varr);
              pcVar39->env[0].__jmpbuf[3] = (long)sVar46.s;
              pVStack_88 = (VARR_char *)0x18fea3;
              set_string_val(pcVar27,(token_t)pcVar39,pcVar27->temp_string,iStack_7c);
              pcVar14 = pcVar39;
              goto LAB_0018fb27;
            }
            pVStack_88 = (VARR_char *)0x18ffbc;
            pre_out_cold_3();
            goto LAB_0018ffbc;
          }
        }
        else {
          pcVar35 = (code *)((long)&pcStack_70->ctx->gen_ctx + lStack_78 + 2);
          do {
            pVVar29 = pcVar27->temp_string;
            pcVar14 = (c2m_ctx_t)pVVar29->varr;
            if (pcVar14 == (c2m_ctx_t)0x0) goto LAB_0018ff56;
            sVar41 = pVVar29->els_num;
            uVar26 = sVar41 + 1;
            if (pVVar29->size < uVar26) {
              pcVar42 = (c2m_ctx_t)((uVar26 >> 1) + uVar26);
              pVStack_88 = (VARR_char *)0x18fdda;
              pcVar31 = pcVar42;
              varr = pcVar14;
              pcVar14 = (c2m_ctx_t)realloc(pcVar14,(size_t)pcVar42);
              pVVar29->varr = (char *)pcVar14;
              pVVar29->size = (size_t)pcVar42;
              sVar41 = pVVar29->els_num;
              uVar26 = sVar41 + 1;
            }
            pVVar29->els_num = uVar26;
            *(char *)((long)pcVar14->env[0].__jmpbuf + (sVar41 - 0x10)) = (char)ppVar38;
            cVar37 = *pcVar35;
            ppVar38 = (pre_ctx *)CONCAT71((int7)((ulong)ppVar38 >> 8),cVar37);
            pcVar35 = pcVar35 + 1;
          } while (cVar37 != (code)0x0);
          pVVar36 = pcVar27->temp_string;
          if (pVVar36 != (VARR_char *)0x0) goto LAB_0018fe0e;
        }
        goto LAB_0018ff6a;
      }
      goto LAB_0018ff74;
    }
LAB_0018f8b3:
    pVStack_40 = (VARR_char *)0x18f8c0;
    fputc(10,pFVar5);
LAB_0018f8c0:
    if (1 < (t->pos).ln_pos) {
      iVar28 = 0;
      do {
        pVStack_40 = (VARR_char *)0x18f8d9;
        fputc(0x20,pFVar5);
        iVar28 = iVar28 + 1;
      } while (iVar28 < (t->pos).ln_pos + -1);
    }
    sVar41 = *(size_t *)&(t->pos).lno;
    pVVar36->els_num = (size_t)(t->pos).fname;
    pVVar36->size = sVar41;
    sVar4 = *(short *)t;
  }
  if (sVar4 == 0x20) {
    pcVar33 = " ";
  }
  else {
    pcVar33 = t->repr;
  }
  pVStack_40 = (VARR_char *)0x18f941;
  fputs(pcVar33,pFVar5);
LAB_0018f941:
  ppVar38->pre_last_token = t;
  return;
LAB_0018ff56:
  pVStack_88 = (VARR_char *)0x18ff5b;
  pre_out_cold_2();
LAB_0018ff5b:
  pVStack_88 = (VARR_char *)0x18ff60;
  pre_out_cold_10();
LAB_0018ff60:
  pVStack_88 = (VARR_char *)0x18ff65;
  pre_out_cold_9();
LAB_0018ff65:
  pVStack_88 = (VARR_char *)0x18ff6a;
  pre_out_cold_5();
LAB_0018ff6a:
  pVStack_88 = (VARR_char *)0x18ff6f;
  pre_out_cold_4();
LAB_0018ff6f:
  pVStack_88 = (VARR_char *)0x18ff74;
  pre_out_cold_8();
LAB_0018ff74:
  pVStack_88 = (VARR_char *)0x18ff79;
  pre_out_cold_7();
LAB_0018ff79:
  pVStack_88 = (VARR_char *)0x18ff98;
  __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
}

Assistant:

static void pre_text_out (c2m_ctx_t c2m_ctx, token_t t) { /* NULL means end of output */
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  int i;
  FILE *f = c2m_options->prepro_output_file;

  if (t == NULL && pre_last_token != NULL && pre_last_token->code == '\n') {
    fprintf (f, "\n");
    return;
  }
  if (t->code == '\n') {
    pre_last_token = t;
    return;
  }
  if (actual_pre_pos.fname != t->pos.fname || actual_pre_pos.lno != t->pos.lno) {
    if (actual_pre_pos.fname == t->pos.fname && actual_pre_pos.lno < t->pos.lno
        && actual_pre_pos.lno + 4 >= t->pos.lno) {
      for (; actual_pre_pos.lno != t->pos.lno; actual_pre_pos.lno++) fprintf (f, "\n");
    } else {
      if (pre_last_token != NULL) fprintf (f, "\n");
      fprintf (f, "#line %d", t->pos.lno);
      if (actual_pre_pos.fname != t->pos.fname) {
        stringify (t->pos.fname, temp_string);
        VARR_PUSH (char, temp_string, '\0');
        fprintf (f, " %s", VARR_ADDR (char, temp_string));
      }
      fprintf (f, "\n");
    }
    for (i = 0; i < t->pos.ln_pos - 1; i++) fprintf (f, " ");
    actual_pre_pos = t->pos;
  }
  fprintf (f, "%s", t->code == ' ' ? " " : t->repr);
  pre_last_token = t;
}